

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O0

FIOBJ fiobj_obj2json2(FIOBJ dest,FIOBJ o,uint8_t pretty)

{
  size_t sVar1;
  fiobj_object_vtable_s *pfVar2;
  FIOBJ local_70;
  obj2json_data_s data;
  fio_json_stack_s stack;
  uint8_t pretty_local;
  FIOBJ o_local;
  FIOBJ dest_local;
  
  if ((dest == 0) || (sVar1 = fiobj_type_is(dest,FIOBJ_T_STRING), sVar1 == 0)) {
    __assert_fail("dest && FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_json.c"
                  ,0x1a3,"FIOBJ fiobj_obj2json2(FIOBJ, FIOBJ, uint8_t)");
  }
  if (o == 0) {
    fiobj_str_write(dest,"null",4);
    dest_local = 0;
  }
  else {
    memset(&data.pretty,0,0x20);
    data.dest = 0;
    data.parent = (FIOBJ)&data.pretty;
    data.stack = (fio_json_stack_s *)&DAT_00000001;
    local_70 = dest;
    data.count._0_1_ = pretty;
    if ((((o != 0) && (o != 0)) && ((o & 1) == 0)) &&
       (((o & 6) != 6 &&
        (pfVar2 = fiobj_type_vtable(o),
        pfVar2->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)))) {
      fiobj_each2(o,fiobj_obj2json_task,&local_70);
      fio_json_stack_free((fio_json_stack_s *)&data.pretty);
      return dest;
    }
    fiobj_obj2json_task(o,&local_70);
    dest_local = dest;
  }
  return dest_local;
}

Assistant:

FIOBJ fiobj_obj2json2(FIOBJ dest, FIOBJ o, uint8_t pretty) {
  assert(dest && FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (!o) {
    fiobj_str_write(dest, "null", 4);
    return 0;
  }
  fio_json_stack_s stack = FIO_ARY_INIT;
  obj2json_data_s data = {
      .dest = dest,
      .stack = &stack,
      .pretty = pretty,
      .count = 1,
  };
  if (!o || !FIOBJ_IS_ALLOCATED(o) || !FIOBJECT2VTBL(o)->each) {
    fiobj_obj2json_task(o, &data);
    return dest;
  }
  fiobj_each2(o, fiobj_obj2json_task, &data);
  fio_json_stack_free(&stack);
  return dest;
}